

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O1

RenderDeviceVkImpl * __thiscall
Diligent::
DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
::GetDevice(DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
            *this)

{
  char (*in_RCX) [10];
  string msg;
  string local_30;
  
  if (this->m_pDevice == (RenderDeviceVkImpl *)0x0) {
    FormatString<char[26],char[10]>
              (&local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pDevice",in_RCX)
    ;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetDevice",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
               ,0xbc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return this->m_pDevice;
}

Assistant:

RenderDeviceImplType* GetDevice() const
    {
        VERIFY_EXPR(m_pDevice);
        return m_pDevice;
    }